

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_bitflags_t sVar5;
  undefined8 uVar6;
  size_t i;
  sysbvm_tuple_t sVar7;
  ulong uVar8;
  anon_struct_160_20_88b2b351 gcFrame;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrame,0,0xa0);
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 0x14;
  local_40 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_58);
  gcFrame.sendNode = (sysbvm_astMessageSendNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.sendNode)->super).analyzerToken = sVar3;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.sendNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  if ((gcFrame.sendNode)->receiver == 0) {
    gcFrame.analyzedSelector =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,(gcFrame.sendNode)->selector,(context->roots).symbolType,arguments[1]);
    (gcFrame.sendNode)->selector = gcFrame.analyzedSelector;
  }
  else {
    gcFrame.analyzedReceiver =
         sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                   (context,(gcFrame.sendNode)->receiver,arguments[1]);
    (gcFrame.sendNode)->receiver = gcFrame.analyzedReceiver;
    if ((gcFrame.analyzedReceiver & 0xf) == 0 && gcFrame.analyzedReceiver != 0) {
      gcFrame.receiverType = *(sysbvm_tuple_t *)(gcFrame.analyzedReceiver + 0x20);
    }
    else {
      gcFrame.receiverType = 0;
    }
    _Var2 = sysbvm_astNode_isTupleWithLookupStartingFromNode(context,gcFrame.analyzedReceiver);
    if (_Var2) {
      sVar3 = *(sysbvm_tuple_t *)(gcFrame.analyzedReceiver + 0x28);
      (gcFrame.sendNode)->receiver = sVar3;
      gcFrame.analyzedReceiverTypeExpression = *(sysbvm_tuple_t *)(gcFrame.analyzedReceiver + 0x30);
      gcFrame.analyzedReceiver = sVar3;
LAB_00122de7:
      (gcFrame.sendNode)->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
    }
    else if ((gcFrame.sendNode)->receiverLookupType != 0) {
      gcFrame.analyzedReceiverTypeExpression =
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                     (context,(gcFrame.sendNode)->receiverLookupType,(context->roots).typeType,
                      arguments[1]);
      goto LAB_00122de7;
    }
    if (gcFrame.receiverType == 0) {
      gcFrame.analyzedSelector =
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                     (context,(gcFrame.sendNode)->selector,(context->roots).symbolType,arguments[1])
      ;
      (gcFrame.sendNode)->selector = gcFrame.analyzedSelector;
      _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedSelector);
      if (_Var2) {
        gcFrame.selector = sysbvm_astLiteralNode_getValue((gcFrame.sendNode)->selector);
        gcFrame.method =
             sysbvm_type_lookupMacroSelector(context,(context->roots).anyValueType,gcFrame.selector)
        ;
      }
    }
    else {
      gcFrame.receiverMetaType = sysbvm_tuple_getType(context,gcFrame.receiverType);
      gcFrame.analysisFunction =
           sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction
                     (context,gcFrame.receiverMetaType);
      if ((gcFrame.analysisFunction != 0) &&
         (_Var2 = sysbvm_astNode_isLiteralNode(context,(gcFrame.sendNode)->receiver), _Var2)) {
        gcFrame.result =
             sysbvm_function_apply3
                       (context,gcFrame.analysisFunction,gcFrame.receiverType,
                        (sysbvm_tuple_t)gcFrame.sendNode,arguments[1]);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
        sysbvm_stackFrame_popRecord(&local_58);
        return gcFrame.result;
      }
      gcFrame.analyzedSelector =
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                     (context,(gcFrame.sendNode)->selector,(context->roots).symbolType,arguments[1])
      ;
      (gcFrame.sendNode)->selector = gcFrame.analyzedSelector;
      _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedSelector);
      if (_Var2) {
        gcFrame.selector = sysbvm_astLiteralNode_getValue((gcFrame.sendNode)->selector);
        gcFrame.methodOwner = gcFrame.receiverType;
        gcFrame.method =
             sysbvm_type_lookupMacroSelector(context,gcFrame.receiverType,gcFrame.selector);
        if (((gcFrame.method == 0) &&
            (gcFrame.method =
                  sysbvm_type_lookupSelector(context,gcFrame.receiverType,gcFrame.selector),
            gcFrame.method == 0)) &&
           (gcFrame.method =
                 sysbvm_type_lookupFallbackSelector(context,gcFrame.receiverType,gcFrame.selector),
           sVar3 = gcFrame.receiverType, gcFrame.method == 0)) {
          _Var2 = sysbvm_type_isReferenceType(gcFrame.receiverType);
          if (_Var2) {
            gcFrame.methodOwner = sysbvm_type_decay(context,sVar3);
            gcFrame.method =
                 sysbvm_type_lookupMacroSelector(context,gcFrame.methodOwner,gcFrame.selector);
            if (((gcFrame.method != 0) ||
                (gcFrame.method =
                      sysbvm_type_lookupSelector(context,gcFrame.methodOwner,gcFrame.selector),
                gcFrame.method != 0)) ||
               (gcFrame.method =
                     sysbvm_type_lookupFallbackSelector
                               (context,gcFrame.methodOwner,gcFrame.selector), gcFrame.method != 0))
            goto LAB_001230c7;
            gcFrame.method = 0;
            sVar3 = gcFrame.receiverType;
          }
          gcFrame.methodOwner = sVar3;
          gcFrame.method =
               sysbvm_type_lookupMacroSelector
                         (context,sVar3,(context->roots).doesNotUnderstandSelector);
          if ((gcFrame.method == 0) &&
             (sVar3 = gcFrame.receiverType,
             gcFrame.method =
                  sysbvm_type_lookupSelector
                            (context,gcFrame.receiverType,(context->roots).doesNotUnderstandSelector
                            ), gcFrame.method == 0)) {
            sVar3 = gcFrame.receiverType;
            gcFrame.method =
                 sysbvm_type_lookupFallbackSelector
                           (context,gcFrame.receiverType,(context->roots).doesNotUnderstandSelector)
            ;
          }
          sVar7 = gcFrame.method;
          _Var2 = sysbvm_function_isMacro((sysbvm_context_t *)gcFrame.method,sVar3);
          if (_Var2) {
            if (sVar7 != 0) {
              gcFrame.macroContext =
                   sysbvm_macroContext_create
                             (context,*arguments,((gcFrame.sendNode)->super).sourcePosition,
                              arguments[1]);
              gcFrame.expansionResult =
                   sysbvm_function_apply3
                             (context,gcFrame.method,gcFrame.macroContext,
                              (gcFrame.sendNode)->receiver,(sysbvm_tuple_t)gcFrame.sendNode);
              sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
              sysbvm_stackFrame_popRecord(&local_58);
              sVar3 = gcFrame.expansionResult;
              goto LAB_001231f9;
            }
          }
          else {
            gcFrame.method = 0;
          }
        }
      }
    }
  }
LAB_001230c7:
  _Var2 = sysbvm_astNode_isLiteralNode(context,(gcFrame.sendNode)->receiverLookupType);
  sVar7 = gcFrame.method;
  sVar3 = gcFrame.methodOwner;
  if (gcFrame.method != 0) {
    if (!_Var2) {
      _Var2 = sysbvm_astNode_isLiteralNode(context,(gcFrame.sendNode)->receiver);
      _Var2 = sysbvm_function_shouldOptimizeLookup(context,sVar7,sVar3,_Var2);
      if (!_Var2) {
        if (gcFrame.method != 0) {
          (gcFrame.sendNode)->boundMethod = gcFrame.method;
          (gcFrame.sendNode)->boundMethodOwner = gcFrame.methodOwner;
          gcFrame.methodType = sysbvm_tuple_getType(context,gcFrame.method);
          sVar3 = sysbvm_tuple_getType(context,gcFrame.methodType);
          gcFrame.analysisFunction =
               sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context,sVar3);
          if (gcFrame.analysisFunction != 0) {
            sysbvm_stackFrame_popRecord(&local_58);
            sVar3 = sysbvm_function_apply3
                              (context,gcFrame.analysisFunction,gcFrame.methodType,
                               (sysbvm_tuple_t)gcFrame.sendNode,arguments[1]);
            return sVar3;
          }
          goto LAB_001232c2;
        }
        goto LAB_0012327e;
      }
    }
    uVar8 = (gcFrame.sendNode)->arguments;
    if ((uVar8 & 0xf) == 0 && uVar8 != 0) {
      uVar8 = (ulong)(*(uint *)(uVar8 + 0xc) >> 3);
    }
    else {
      uVar8 = 0;
    }
    gcFrame.newMethodNode =
         sysbvm_astLiteralNode_create
                   (context,((gcFrame.sendNode)->super).sourcePosition,gcFrame.method);
    gcFrame.newArgumentNodes = sysbvm_array_create(context,uVar8 + 1);
    if ((gcFrame.newArgumentNodes & 0xf) == 0 && gcFrame.newArgumentNodes != 0) {
      *(sysbvm_tuple_t *)(gcFrame.newArgumentNodes + 0x10) = (gcFrame.sendNode)->receiver;
    }
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = (gcFrame.sendNode)->arguments;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        uVar6 = *(undefined8 *)(uVar1 + 0x10 + uVar4 * 8);
      }
      else {
        uVar6 = 0;
      }
      if (gcFrame.newArgumentNodes != 0 && (gcFrame.newArgumentNodes & 0xf) == 0) {
        *(undefined8 *)(gcFrame.newArgumentNodes + 0x18 + uVar4 * 8) = uVar6;
      }
    }
    gcFrame.unexpandedApplicationNode =
         sysbvm_astUnexpandedApplicationNode_create
                   (context,((gcFrame.sendNode)->super).sourcePosition,gcFrame.newMethodNode,
                    gcFrame.newArgumentNodes);
    sysbvm_stackFrame_popRecord(&local_58);
    sVar3 = gcFrame.unexpandedApplicationNode;
LAB_001231f9:
    sVar3 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                      (context,sVar3,arguments[1]);
    return sVar3;
  }
LAB_0012327e:
  if (((((gcFrame.sendNode)->isDynamic != 0x1f) &&
       (sVar3 = sysbvm_type_decay(context,gcFrame.receiverType), sVar3 != 0)) &&
      (_Var2 = sysbvm_tuple_isDummyValue(sVar3), !_Var2)) &&
     (sVar5 = sysbvm_type_getFlags(sVar3), (sVar5 & 0x40) == 0)) {
    sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
  }
LAB_001232c2:
  gcFrame.analyzedReceiver =
       sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                 (context,gcFrame.analyzedReceiver,arguments[1]);
  (gcFrame.sendNode)->receiver = gcFrame.analyzedReceiver;
  uVar8 = (gcFrame.sendNode)->arguments;
  if ((uVar8 & 0xf) == 0 && uVar8 != 0) {
    sVar3 = (sysbvm_tuple_t)(*(uint *)(uVar8 + 0xc) >> 3);
  }
  else {
    sVar3 = 0;
  }
  gcFrame.analyzedArguments = sysbvm_array_create(context,sVar3);
  for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
    uVar8 = (gcFrame.sendNode)->arguments;
    if ((uVar8 & 0xf) == 0 && uVar8 != 0) {
      gcFrame.argumentNode = *(sysbvm_tuple_t *)(uVar8 + 0x10 + sVar7 * 8);
    }
    else {
      gcFrame.argumentNode = 0;
    }
    gcFrame.analyzedArgumentNode =
         sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                   (context,gcFrame.argumentNode,arguments[1]);
    if ((gcFrame.analyzedArguments & 0xf) == 0 && gcFrame.analyzedArguments != 0) {
      *(sysbvm_tuple_t *)(gcFrame.analyzedArguments + 0x10 + sVar7 * 8) =
           gcFrame.analyzedArgumentNode;
    }
  }
  (gcFrame.sendNode)->arguments = gcFrame.analyzedArguments;
  ((gcFrame.sendNode)->super).analyzedType = (context->roots).anyValueType;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_58);
  return (sysbvm_tuple_t)gcFrame.sendNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageSendNode_t *sendNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t methodOwner;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t result;
        sysbvm_tuple_t newMethodNode;
        sysbvm_tuple_t newArgumentNodes;
        sysbvm_tuple_t unexpandedApplicationNode;

        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgumentNode;

        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sendNode = (sysbvm_astMessageSendNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.sendNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sendNode->super.sourcePosition);

    bool isDoesNotUnderstand = false;
    if(gcFrame.sendNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.sendNode->receiver, *environment);
        gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
            
        }
        else if(gcFrame.sendNode->receiverLookupType)
        {
            gcFrame.analyzedReceiverTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->receiverLookupType, context->roots.typeType, *environment);
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        if(gcFrame.receiverType)
        {
            // If the receiver is a literal node, we can attempt to forward the message send node analysis.
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);

            // HACK: Remove this literal check when properly implementing this.
            if(gcFrame.analysisFunction && sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))
            {
                gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }

            // If the selector is a literal, attempt to perform a static lookup.
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.methodOwner = gcFrame.receiverType;
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);

                if(!gcFrame.method && sysbvm_type_isReferenceType(gcFrame.receiverType))
                {
                    gcFrame.methodOwner = sysbvm_type_decay(context, gcFrame.receiverType);
                    gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.methodOwner, gcFrame.selector);
                }

                // does not understand macro?
                if(!gcFrame.method)
                {
                    gcFrame.methodOwner = gcFrame.receiverType;
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);

                    if(!sysbvm_function_isMacro(context, gcFrame.method))
                        gcFrame.method = SYSBVM_NULL_TUPLE;
                    isDoesNotUnderstand = gcFrame.method != SYSBVM_NULL_TUPLE;
                }
            }
        }
        else
        {
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, context->roots.anyValueType, gcFrame.selector);
            }
        }
    }
    else
    {
        gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
        gcFrame.sendNode->selector = gcFrame.analyzedSelector;
    }

    // Does not understand: 
    if(isDoesNotUnderstand && sysbvm_function_isMacro(context, gcFrame.method))
    {
        // Clear the analyzer token.
        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, gcFrame.sendNode->super.sourcePosition, *environment);
        gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.sendNode->receiver, (sysbvm_tuple_t)gcFrame.sendNode);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Turn this node onto an unexpanded application.
    bool hasExplicitSolvedLookupType = sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiverLookupType);
    if(gcFrame.method && (hasExplicitSolvedLookupType || sysbvm_function_shouldOptimizeLookup(context, gcFrame.method, gcFrame.methodOwner, sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))))
    {
        size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
        gcFrame.newMethodNode = sysbvm_astLiteralNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.method);

        gcFrame.newArgumentNodes = sysbvm_array_create(context, 1 + applicationArgumentCount);
        sysbvm_array_atPut(gcFrame.newArgumentNodes, 0, gcFrame.sendNode->receiver);
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.newArgumentNodes, i + 1, sysbvm_array_at(gcFrame.sendNode->arguments, i));

        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.newMethodNode, gcFrame.newArgumentNodes);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }

    if(gcFrame.method)
    {
        gcFrame.sendNode->boundMethod = gcFrame.method;
        gcFrame.sendNode->boundMethodOwner = gcFrame.methodOwner;
        gcFrame.methodType = sysbvm_tuple_getType(context, gcFrame.method);

        gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.methodType));
        if(gcFrame.analysisFunction)
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.methodType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
        }
    }
    else
    {
        if(!sysbvm_tuple_boolean_decode(gcFrame.sendNode->isDynamic) && !sysbvm_type_isDynamic(sysbvm_type_decay(context, gcFrame.receiverType)))
            sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
    }

    gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
    gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.sendNode->arguments, i);
        gcFrame.analyzedArgumentNode = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgumentNode);
    }

    gcFrame.sendNode->arguments = gcFrame.analyzedArguments;
    gcFrame.sendNode->super.analyzedType = context->roots.anyValueType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.sendNode;
}